

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TapeUEF.cpp
# Opt level: O1

void __thiscall Storage::Tape::UEF::get_next_pulses(UEF *this)

{
  bool bVar1;
  ulong uVar2;
  float fVar3;
  uint8_t bytes [2];
  Chunk next_chunk;
  LogLine local_48;
  Chunk local_40;
  
  do {
    bVar1 = PulseQueuedTape::empty(&this->super_PulseQueuedTape);
    if (!bVar1) {
      return;
    }
    bVar1 = get_next_chunk(this,&local_40);
    if (bVar1) {
      uVar2 = (ulong)local_40.id;
      switch(local_40.id) {
      case 0x100:
        queue_implicit_bit_pattern(this,local_40.length);
        break;
      default:
        local_48.stream_ = (FILE *)_stdout;
        fprintf(_stdout,"[%s] ","UEF");
        Log::Logger<(Log::Source)29>::LogLine::append(&local_48,"Skipping chunk of type %04x",uVar2)
        ;
        fputc(10,(FILE *)local_48.stream_);
        break;
      case 0x102:
        queue_explicit_bit_pattern(this,local_40.length);
        break;
      case 0x104:
        queue_defined_data(this,local_40.length);
        break;
      case 0x110:
        queue_carrier_tone(this);
        break;
      case 0x111:
        queue_carrier_tone_with_dummy(this);
        break;
      case 0x112:
        queue_integer_gap(this);
        break;
      case 0x113:
        fVar3 = gzgetfloat(this->file_);
        fVar3 = roundf(fVar3);
        this->time_base_ = (uint)(long)fVar3;
        break;
      case 0x114:
        queue_security_cycles(this);
        break;
      case 0x116:
        fVar3 = gzgetfloat(this->file_);
        PulseQueuedTape::emplace_back
                  (&this->super_PulseQueuedTape,Zero,
                   (Time)((long)(fVar3 * 4e+06) & 0xffffffffU | 0x3d090000000000));
        break;
      case 0x117:
        gzread(this->file_,&local_48,2);
        this->is_300_baud_ = (short)local_48.stream_ == 300;
      }
      gzseek(this->file_,local_40.start_of_next_chunk,0);
    }
    else {
      PulseQueuedTape::set_is_at_end(&this->super_PulseQueuedTape,true);
    }
  } while (bVar1);
  return;
}

Assistant:

void UEF::get_next_pulses() {
	while(empty()) {
		// read chunk details
		Chunk next_chunk;
		if(!get_next_chunk(next_chunk)) {
			set_is_at_end(true);
			return;
		}

		switch(next_chunk.id) {
			case 0x0100:	queue_implicit_bit_pattern(next_chunk.length);	break;
			case 0x0102:	queue_explicit_bit_pattern(next_chunk.length);	break;
			case 0x0112:	queue_integer_gap();							break;
			case 0x0116:	queue_floating_point_gap();						break;

			case 0x0110:	queue_carrier_tone();							break;
			case 0x0111:	queue_carrier_tone_with_dummy();				break;

			case 0x0114:	queue_security_cycles();						break;
			case 0x0104:	queue_defined_data(next_chunk.length);			break;

			// change of base rate
			case 0x0113: {
				// TODO: something smarter than just converting this to an int
				const float new_time_base = gzgetfloat(file_);
				time_base_ = unsigned(roundf(new_time_base));
			}
			break;

			case 0x0117: {
				const int baud_rate = gzget16(file_);
				is_300_baud_ = (baud_rate == 300);
			}
			break;

			default:
				logger.info().append("Skipping chunk of type %04x", next_chunk.id);
			break;
		}

		gzseek(file_, next_chunk.start_of_next_chunk, SEEK_SET);
	}
}